

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

size_t __thiscall cmListFileBacktrace::Depth(cmListFileBacktrace *this)

{
  Entry *local_28;
  Entry *i;
  size_t depth;
  cmListFileBacktrace *this_local;
  
  i = (Entry *)0x0;
  if (this->Cur == (Entry *)0x0) {
    this_local = (cmListFileBacktrace *)0x0;
  }
  else {
    for (local_28 = this->Cur->Up; local_28 != (Entry *)0x0; local_28 = local_28->Up) {
      i = (Entry *)&(i->super_cmListFileContext).Name.field_0x1;
    }
    this_local = (cmListFileBacktrace *)i;
  }
  return (size_t)this_local;
}

Assistant:

size_t cmListFileBacktrace::Depth() const
{
  size_t depth = 0;
  if (this->Cur == CM_NULLPTR) {
    return 0;
  }

  for (Entry* i = this->Cur->Up; i; i = i->Up) {
    depth++;
  }
  return depth;
}